

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.cpp
# Opt level: O0

bool llvm::consumeSignedInteger(StringRef *Str,uint Radix,longlong *Result)

{
  char cVar1;
  bool bVar2;
  unsigned_long *puVar3;
  char *pcVar4;
  undefined1 local_b8 [8];
  StringRef Str2;
  unsigned_long_long ULLVal;
  longlong *Result_local;
  uint Radix_local;
  StringRef *Str_local;
  unsigned_long local_58 [3];
  StringRef *local_40;
  undefined1 local_38 [16];
  StringRef *local_28;
  char *local_20;
  char *local_18;
  undefined1 *local_10;
  
  local_28 = Str;
  if ((Str->Length == 0) || (cVar1 = StringRef::front(Str), cVar1 != '-')) {
    bVar2 = consumeUnsignedInteger(Str,Radix,&Str2.Length);
    if ((bVar2) || ((long)Str2.Length < 0)) {
      Str_local._7_1_ = true;
    }
    else {
      *Result = Str2.Length;
      Str_local._7_1_ = false;
    }
  }
  else {
    if (Str->Length == 0) {
      __assert_fail("size() >= N && \"Dropping more elements than exist\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/StringRef.h"
                    ,0x286,"StringRef llvm::StringRef::drop_front(size_t) const");
    }
    local_58[2] = 1;
    local_58[1] = 0xffffffffffffffff;
    local_40 = Str;
    puVar3 = std::min<unsigned_long>(local_58 + 2,&Str->Length);
    local_58[2] = *puVar3;
    pcVar4 = Str->Data + local_58[2];
    local_58[0] = Str->Length - local_58[2];
    puVar3 = std::min<unsigned_long>(local_58 + 1,local_58);
    Str2.Data = (char *)*puVar3;
    local_10 = local_38;
    local_b8 = (undefined1  [8])pcVar4;
    local_20 = Str2.Data;
    local_18 = pcVar4;
    bVar2 = consumeUnsignedInteger((StringRef *)local_b8,Radix,&Str2.Length);
    if ((bVar2) || ((long)Str2.Length < 0)) {
      Str_local._7_1_ = true;
    }
    else {
      Str->Data = (char *)local_b8;
      Str->Length = (size_t)Str2.Data;
      *Result = -Str2.Length;
      Str_local._7_1_ = false;
    }
  }
  return Str_local._7_1_;
}

Assistant:

bool llvm::consumeSignedInteger(StringRef &Str, unsigned Radix,
                                long long &Result) {
  unsigned long long ULLVal;

  // Handle positive strings first.
  if (Str.empty() || Str.front() != '-') {
    if (consumeUnsignedInteger(Str, Radix, ULLVal) ||
        // Check for value so large it overflows a signed value.
        (long long)ULLVal < 0)
      return true;
    Result = ULLVal;
    return false;
  }

  // Get the positive part of the value.
  StringRef Str2 = Str.drop_front(1);
  if (consumeUnsignedInteger(Str2, Radix, ULLVal) ||
      // Reject values so large they'd overflow as negative signed, but allow
      // "-0".  This negates the unsigned so that the negative isn't undefined
      // on signed overflow.
      (long long)-ULLVal > 0)
    return true;

  Str = Str2;
  Result = -ULLVal;
  return false;
}